

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

void __thiscall ezexample::remns(ezexample *this)

{
  uchar **ppuVar1;
  pointer puVar2;
  example *peVar3;
  
  peVar3 = this->ec;
  if ((peVar3->super_example_predict).indices._end == (peVar3->super_example_predict).indices._begin
     ) {
    this->current_seed = 0;
    this->current_ns = '\0';
  }
  else {
    if (this->ns_exists[this->current_ns] == true) {
      peVar3->total_sum_feat_sq =
           peVar3->total_sum_feat_sq -
           (peVar3->super_example_predict).feature_space[this->current_ns].sum_feat_sq;
      features::clear((this->ec->super_example_predict).feature_space + this->current_ns);
      peVar3 = this->ec;
      peVar3->num_features =
           peVar3->num_features -
           ((long)(peVar3->super_example_predict).feature_space[this->current_ns].values._end -
            (long)(peVar3->super_example_predict).feature_space[this->current_ns].values._begin >> 2
           );
      this->ns_exists[this->current_ns] = false;
      peVar3 = this->ec;
    }
    puVar2 = (this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this->current_seed = puVar2[-1];
    (this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2 + -1;
    ppuVar1 = &(peVar3->super_example_predict).indices._end;
    *ppuVar1 = *ppuVar1 + -1;
    this->example_changed_since_prediction = true;
  }
  return;
}

Assistant:

void remns()
  {
    if (ec->indices.size() == 0)
    {
      current_seed = 0;
      current_ns = 0;
    }
    else
    {
      if (ns_exists[(int)current_ns])
      {
        ec->total_sum_feat_sq -= ec->feature_space[(int)current_ns].sum_feat_sq;
        ec->feature_space[(int)current_ns].clear();
        ec->num_features -= ec->feature_space[(int)current_ns].size();

        ns_exists[(int)current_ns] = false;
      }

      current_seed = past_seeds.back();
      past_seeds.pop_back();
      ec->indices.pop();
      example_changed_since_prediction = true;
    }
  }